

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void boost::exception_detail::copy_boost_exception(exception *a,exception *b)

{
  error_info_container *peVar1;
  char *pcVar2;
  int iVar3;
  refcount_ptr<boost::exception_detail::error_info_container> data;
  refcount_ptr<boost::exception_detail::error_info_container> local_20;
  refcount_ptr<boost::exception_detail::error_info_container> local_18;
  
  local_20.px_ = (error_info_container *)0x0;
  peVar1 = (b->data_).px_;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x28))(&local_18);
    refcount_ptr<boost::exception_detail::error_info_container>::adopt(&local_20,local_18.px_);
    refcount_ptr<boost::exception_detail::error_info_container>::~refcount_ptr(&local_18);
  }
  pcVar2 = b->throw_file_;
  a->throw_function_ = b->throw_function_;
  a->throw_file_ = pcVar2;
  iVar3 = b->throw_column_;
  a->throw_line_ = b->throw_line_;
  a->throw_column_ = iVar3;
  refcount_ptr<boost::exception_detail::error_info_container>::adopt(&a->data_,local_20.px_);
  refcount_ptr<boost::exception_detail::error_info_container>::~refcount_ptr(&local_20);
  return;
}

Assistant:

refcount_ptr():
                px_(0)
                {
                }